

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O0

Barcodes * __thiscall ZXing::QRCode::Reader::decode(Reader *this,BinaryBitmap *image,int maxSymbols)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  long in_RSI;
  Barcodes *in_RDI;
  DecoderResult decoderResult_2;
  DetectorResult detectorResult_2;
  ConcentricPattern *fp_1;
  iterator __end3_2;
  iterator __begin3_2;
  FinderPatterns *__range3_2;
  DecoderResult decoderResult_1;
  DetectorResult detectorResult_1;
  ConcentricPattern *fp;
  iterator __end3_1;
  iterator __begin3_1;
  FinderPatterns *__range3_1;
  DecoderResult decoderResult;
  DetectorResult detectorResult;
  FinderPatternSet *fpSet;
  iterator __end3;
  iterator __begin3;
  FinderPatternSets *__range3;
  FinderPatternSets allFPSets;
  vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> usedFPs;
  FinderPatterns allFPs;
  BitMatrix *binImg;
  Barcodes *res;
  FinderPatternSet *in_stack_000007c0;
  BitMatrix *in_stack_000007c8;
  int in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  DecoderResult *in_stack_fffffffffffffb50;
  undefined2 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5a;
  undefined4 in_stack_fffffffffffffb5b;
  undefined1 in_stack_fffffffffffffb5f;
  DecoderResult *in_stack_fffffffffffffb60;
  DecoderResult *this_00;
  int in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  BitMatrix *in_stack_fffffffffffffb70;
  DetectorResult local_360;
  reference local_320;
  ConcentricPattern *local_318;
  __normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
  local_310;
  undefined1 *local_308;
  Flags<ZXing::BarcodeFormat> local_300;
  undefined4 local_2fc;
  FinderPatterns *in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffdb7;
  BitMatrix *in_stack_fffffffffffffdb8;
  DetectorResult local_228;
  reference local_1e8;
  ConcentricPattern *local_1e0;
  __normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
  local_1d8;
  undefined1 *local_1d0;
  Flags<ZXing::BarcodeFormat> local_1c4;
  int local_1c0;
  undefined4 local_1bc;
  ConcentricPattern *in_stack_fffffffffffffe90;
  BitMatrix *in_stack_fffffffffffffe98;
  DetectorResult local_e8;
  reference in_stack_ffffffffffffff58;
  __normal_iterator<ZXing::QRCode::FinderPatternSet_*,_std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_78 [24];
  Flags<ZXing::BarcodeFormat> local_60;
  undefined1 local_59;
  undefined1 local_40 [24];
  BitMatrix *local_28;
  int local_1c;
  
  local_1c = in_ECX;
  local_28 = BinaryBitmap::getBitMatrix((BinaryBitmap *)in_stack_fffffffffffffb50);
  if (local_28 == (BitMatrix *)0x0) {
    memset(in_RDI,0,0x18);
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)0x2fd38b);
    return in_RDI;
  }
  ReaderOptions::tryHarder(*(ReaderOptions **)(in_RSI + 8));
  FindFinderPatterns(in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7);
  std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::vector
            ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)0x2fd3d0
            );
  local_59 = 0;
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::vector
            ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)0x2fd3e2);
  Flags<ZXing::BarcodeFormat>::Flags(&local_60,QRCode);
  bVar1 = ReaderOptions::hasFormat
                    ((ReaderOptions *)
                     CONCAT17(in_stack_fffffffffffffb5f,
                              CONCAT43(in_stack_fffffffffffffb5b,
                                       CONCAT12(in_stack_fffffffffffffb5a,in_stack_fffffffffffffb58)
                                      )),
                     (BarcodeFormats)(Int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  if (bVar1) {
    GenerateFinderPatternSets(in_stack_fffffffffffffd98);
    local_90 = local_78;
    local_98._M_current =
         (FinderPatternSet *)
         std::
         vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>::
         begin((vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>::
    end((vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_> *
        )CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ZXing::QRCode::FinderPatternSet_*,_std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>_>
                               *)in_stack_fffffffffffffb50,
                              (__normal_iterator<ZXing::QRCode::FinderPatternSet_*,_std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)),
          bVar1) {
      in_stack_ffffffffffffff58 =
           __gnu_cxx::
           __normal_iterator<ZXing::QRCode::FinderPatternSet_*,_std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>_>
           ::operator*(&local_98);
      bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                        ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                          *)in_stack_fffffffffffffb60,
                         (ConcentricPattern *)
                         CONCAT17(in_stack_fffffffffffffb5f,
                                  CONCAT43(in_stack_fffffffffffffb5b,
                                           CONCAT12(in_stack_fffffffffffffb5a,
                                                    in_stack_fffffffffffffb58))));
      if (((!bVar1) &&
          (bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                             ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                               *)in_stack_fffffffffffffb60,
                              (ConcentricPattern *)
                              CONCAT17(in_stack_fffffffffffffb5f,
                                       CONCAT43(in_stack_fffffffffffffb5b,
                                                CONCAT12(in_stack_fffffffffffffb5a,
                                                         in_stack_fffffffffffffb58)))), !bVar1)) &&
         (bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                            ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                              *)in_stack_fffffffffffffb60,
                             (ConcentricPattern *)
                             CONCAT17(in_stack_fffffffffffffb5f,
                                      CONCAT43(in_stack_fffffffffffffb5b,
                                               CONCAT12(in_stack_fffffffffffffb5a,
                                                        in_stack_fffffffffffffb58)))), !bVar1)) {
        logFPSet(in_stack_ffffffffffffff58);
        SampleQR(in_stack_000007c8,in_stack_000007c0);
        bVar1 = DetectorResult::isValid((DetectorResult *)0x2fd587);
        if (bVar1) {
          DetectorResult::bits(&local_e8);
          Decode((BitMatrix *)in_stack_ffffffffffffff58);
          bVar1 = DecoderResult::isValid(in_stack_fffffffffffffb60,(bool)in_stack_fffffffffffffb5f);
          if (bVar1) {
            std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
            push_back((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *
                      )in_stack_fffffffffffffb60,
                      (value_type *)
                      CONCAT17(in_stack_fffffffffffffb5f,
                               CONCAT43(in_stack_fffffffffffffb5b,
                                        CONCAT12(in_stack_fffffffffffffb5a,in_stack_fffffffffffffb58
                                                ))));
            std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
            push_back((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *
                      )in_stack_fffffffffffffb60,
                      (value_type *)
                      CONCAT17(in_stack_fffffffffffffb5f,
                               CONCAT43(in_stack_fffffffffffffb5b,
                                        CONCAT12(in_stack_fffffffffffffb5a,in_stack_fffffffffffffb58
                                                ))));
            std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
            push_back((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *
                      )in_stack_fffffffffffffb60,
                      (value_type *)
                      CONCAT17(in_stack_fffffffffffffb5f,
                               CONCAT43(in_stack_fffffffffffffb5b,
                                        CONCAT12(in_stack_fffffffffffffb5a,in_stack_fffffffffffffb58
                                                ))));
          }
          ReaderOptions::returnErrors(*(ReaderOptions **)(in_RSI + 8));
          bVar1 = DecoderResult::isValid(in_stack_fffffffffffffb60,(bool)in_stack_fffffffffffffb5f);
          if (bVar1) {
            local_1bc = 0x2000;
            std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
            emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                      ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                       in_stack_fffffffffffffb70,
                       (DecoderResult *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       (DetectorResult *)in_stack_fffffffffffffb60,
                       (BarcodeFormat *)
                       CONCAT17(in_stack_fffffffffffffb5f,
                                CONCAT43(in_stack_fffffffffffffb5b,
                                         CONCAT12(in_stack_fffffffffffffb5a,
                                                  in_stack_fffffffffffffb58))));
            if ((local_1c == 0) ||
               (iVar2 = Size<std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
                                  ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                   in_stack_fffffffffffffb50), iVar2 != local_1c))
            goto LAB_002fd705;
            local_1c0 = 2;
          }
          else {
LAB_002fd705:
            local_1c0 = 0;
          }
          DecoderResult::~DecoderResult(in_stack_fffffffffffffb50);
          if (local_1c0 == 0) goto LAB_002fd72c;
        }
        else {
LAB_002fd72c:
          local_1c0 = 0;
        }
        DetectorResult::~DetectorResult((DetectorResult *)0x2fd744);
        if (local_1c0 != 0) break;
      }
      __gnu_cxx::
      __normal_iterator<ZXing::QRCode::FinderPatternSet_*,_std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>_>
      ::operator++(&local_98);
    }
    std::vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>::
    ~vector((vector<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
             *)in_stack_fffffffffffffb60);
  }
  Flags<ZXing::BarcodeFormat>::Flags(&local_1c4,MicroQRCode);
  bVar1 = ReaderOptions::hasFormat
                    ((ReaderOptions *)
                     CONCAT17(in_stack_fffffffffffffb5f,
                              CONCAT43(in_stack_fffffffffffffb5b,
                                       CONCAT12(in_stack_fffffffffffffb5a,in_stack_fffffffffffffb58)
                                      )),
                     (BarcodeFormats)(Int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  if ((bVar1) &&
     ((local_1c == 0 ||
      (iVar2 = Size<std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
                         ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                          in_stack_fffffffffffffb50), iVar2 != local_1c)))) {
    local_1d0 = local_40;
    local_1d8._M_current =
         (ConcentricPattern *)
         std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::begin
                   ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)
                    CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_1e0 = (ConcentricPattern *)
                std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
                end((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)
                    CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
                               *)in_stack_fffffffffffffb50,
                              (__normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)),
          bVar1) {
      local_1e8 = __gnu_cxx::
                  __normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
                  ::operator*(&local_1d8);
      bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                        ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                          *)in_stack_fffffffffffffb60,
                         (ConcentricPattern *)
                         CONCAT17(in_stack_fffffffffffffb5f,
                                  CONCAT43(in_stack_fffffffffffffb5b,
                                           CONCAT12(in_stack_fffffffffffffb5a,
                                                    in_stack_fffffffffffffb58))));
      if (!bVar1) {
        SampleMQR(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        bVar1 = DetectorResult::isValid((DetectorResult *)0x2fd8bf);
        if (bVar1) {
          in_stack_fffffffffffffb70 = DetectorResult::bits(&local_228);
          Decode((BitMatrix *)in_stack_ffffffffffffff58);
          ReaderOptions::returnErrors(*(ReaderOptions **)(in_RSI + 8));
          bVar1 = DecoderResult::isValid(in_stack_fffffffffffffb60,(bool)in_stack_fffffffffffffb5f);
          in_stack_fffffffffffffb6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb6c);
          if (bVar1) {
            local_2fc = 0x10000;
            std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
            emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                      ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                       in_stack_fffffffffffffb70,
                       (DecoderResult *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       (DetectorResult *)in_stack_fffffffffffffb60,
                       (BarcodeFormat *)
                       CONCAT17(in_stack_fffffffffffffb5f,
                                CONCAT43(in_stack_fffffffffffffb5b,
                                         CONCAT12(in_stack_fffffffffffffb5a,
                                                  in_stack_fffffffffffffb58))));
            if ((local_1c == 0) ||
               (in_stack_fffffffffffffb68 =
                     Size<std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
                               ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                in_stack_fffffffffffffb50), in_stack_fffffffffffffb68 != local_1c))
            goto LAB_002fd9cc;
            local_1c0 = 4;
          }
          else {
LAB_002fd9cc:
            local_1c0 = 0;
          }
          DecoderResult::~DecoderResult(in_stack_fffffffffffffb50);
          if (local_1c0 == 0) goto LAB_002fd9f3;
        }
        else {
LAB_002fd9f3:
          local_1c0 = 0;
        }
        DetectorResult::~DetectorResult((DetectorResult *)0x2fda0b);
        if (local_1c0 != 0) break;
      }
      __gnu_cxx::
      __normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
      ::operator++(&local_1d8);
    }
  }
  this_00 = *(DecoderResult **)(in_RSI + 8);
  Flags<ZXing::BarcodeFormat>::Flags(&local_300,RMQRCode);
  bVar1 = ReaderOptions::hasFormat
                    ((ReaderOptions *)
                     CONCAT17(in_stack_fffffffffffffb5f,
                              CONCAT43(in_stack_fffffffffffffb5b,
                                       CONCAT12(in_stack_fffffffffffffb5a,in_stack_fffffffffffffb58)
                                      )),(BarcodeFormats)(Int)((ulong)this_00 >> 0x20));
  if (bVar1) {
    if (local_1c != 0) {
      iVar2 = Size<std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
                        ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                         in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb5b = CONCAT31((int3)iVar2,(char)in_stack_fffffffffffffb5b);
      in_stack_fffffffffffffb5f = (undefined1)((uint)iVar2 >> 0x18);
      if (iVar2 == local_1c) goto LAB_002fdce8;
    }
    local_308 = local_40;
    local_310._M_current =
         (ConcentricPattern *)
         std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::begin
                   ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)
                    CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_318 = (ConcentricPattern *)
                std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::
                end((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)
                    CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
                               *)in_stack_fffffffffffffb50,
                              (__normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)),
          bVar1) {
      local_320 = __gnu_cxx::
                  __normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
                  ::operator*(&local_310);
      bVar1 = Contains<std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>,ZXing::ConcentricPattern>
                        ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                          *)this_00,
                         (ConcentricPattern *)
                         CONCAT17(in_stack_fffffffffffffb5f,
                                  CONCAT43(in_stack_fffffffffffffb5b,
                                           CONCAT12(in_stack_fffffffffffffb5a,
                                                    in_stack_fffffffffffffb58))));
      in_stack_fffffffffffffb5b = CONCAT31((int3)((uint)in_stack_fffffffffffffb5b >> 8),bVar1);
      if (!bVar1) {
        SampleRMQR((BitMatrix *)decoderResult_2._content._48_8_,
                   (ConcentricPattern *)
                   decoderResult_2._content.encodings.
                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        in_stack_fffffffffffffb5a = DetectorResult::isValid((DetectorResult *)0x2fdb6a);
        if ((bool)in_stack_fffffffffffffb5a) {
          in_stack_fffffffffffffb50 = (DecoderResult *)DetectorResult::bits(&local_360);
          Decode((BitMatrix *)in_stack_ffffffffffffff58);
          ReaderOptions::returnErrors(*(ReaderOptions **)(in_RSI + 8));
          bVar1 = DecoderResult::isValid(this_00,(bool)in_stack_fffffffffffffb5f);
          in_stack_fffffffffffffb4c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb4c);
          if (((bVar1) &&
              (std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
               emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                         ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                          in_stack_fffffffffffffb70,
                          (DecoderResult *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                          (DetectorResult *)this_00,
                          (BarcodeFormat *)
                          CONCAT17(in_stack_fffffffffffffb5f,
                                   CONCAT43(in_stack_fffffffffffffb5b,
                                            CONCAT12(in_stack_fffffffffffffb5a,
                                                     in_stack_fffffffffffffb58)))), local_1c != 0))
             && (in_stack_fffffffffffffb48 =
                      Size<std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
                                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                 in_stack_fffffffffffffb50), in_stack_fffffffffffffb48 == local_1c))
          {
            local_1c0 = 6;
          }
          else {
            local_1c0 = 0;
          }
          DecoderResult::~DecoderResult(in_stack_fffffffffffffb50);
          if (local_1c0 == 0) goto LAB_002fdc9c;
        }
        else {
LAB_002fdc9c:
          local_1c0 = 0;
        }
        DetectorResult::~DetectorResult((DetectorResult *)0x2fdcb4);
        if (local_1c0 != 0) break;
      }
      __gnu_cxx::
      __normal_iterator<ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
      ::operator++(&local_310);
    }
  }
LAB_002fdce8:
  local_59 = 1;
  local_1c0 = 1;
  std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::~vector
            ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)this_00)
  ;
  std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>::~vector
            ((vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> *)this_00)
  ;
  return in_RDI;
}

Assistant:

Barcodes Reader::decode(const BinaryBitmap& image, int maxSymbols) const
{
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

#ifdef PRINT_DEBUG
	LogMatrixWriter lmw(log, *binImg, 5, "qr-log.pnm");
#endif
	
	auto allFPs = FindFinderPatterns(*binImg, _opts.tryHarder());

#ifdef PRINT_DEBUG
	printf("allFPs: %d\n", Size(allFPs));
#endif

	std::vector<ConcentricPattern> usedFPs;
	Barcodes res;
	
	if (_opts.hasFormat(BarcodeFormat::QRCode)) {
		auto allFPSets = GenerateFinderPatternSets(allFPs);
		for (const auto& fpSet : allFPSets) {
			if (Contains(usedFPs, fpSet.bl) || Contains(usedFPs, fpSet.tl) || Contains(usedFPs, fpSet.tr))
				continue;

			logFPSet(fpSet);

			auto detectorResult = SampleQR(*binImg, fpSet);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid()) {
					usedFPs.push_back(fpSet.bl);
					usedFPs.push_back(fpSet.tl);
					usedFPs.push_back(fpSet.tr);
				}
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::QRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}
			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::MicroQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		// TODO proper
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleRMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::RMQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}

	return res;
}